

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokth.c
# Opt level: O0

int tokthscan(tokthdef *tab,uint hash,_func_int_void_ptr_toksdef_ptr_mcmon *cb,void *cbctx)

{
  ulong uVar1;
  int iVar2;
  undefined8 in_RCX;
  code *in_RDX;
  uint in_ESI;
  long in_RDI;
  mcmon curobj;
  mcmcxdef *mctx;
  uchar *pg;
  tokthpdef nxt;
  tokthpdef p;
  toksdef *sym;
  tokshdef *symh;
  mcmon in_stack_ffffffffffffff9e;
  undefined6 in_stack_ffffffffffffffa0;
  mcmon mVar3;
  mcmcxdef *ctx;
  uchar *local_50;
  mcmon local_48;
  ulong local_40;
  
  ctx = *(mcmcxdef **)(in_RDI + 0x30);
  uVar1 = *(ulong *)(in_RDI + 0x38 + (ulong)in_ESI * 8);
  local_40._0_2_ = (mcmon)uVar1;
  mVar3 = (mcmon)local_40;
  if ((mcmon)local_40 != 0xffff) {
    local_50 = mcmlck(ctx,(mcmon)local_40);
    mVar3 = (mcmon)local_40;
  }
  while( true ) {
    local_40 = uVar1;
    if ((mcmon)local_40 == -1) {
      if (mVar3 != 0xffff) {
        mcmunlck((mcmcxdef *)CONCAT26(mVar3,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff9e);
      }
      return 0;
    }
    uVar1 = *(ulong *)(local_50 + (local_40 >> 0x20));
    iVar2 = (*in_RDX)(in_RCX,(ulong *)((long)(local_50 + (local_40 >> 0x20)) + 8),local_40 & 0xffff)
    ;
    if (iVar2 != 0) break;
    local_48 = (mcmon)uVar1;
    if ((local_48 != mVar3) && (local_48 != 0xffff)) {
      mcmunlck((mcmcxdef *)CONCAT26(mVar3,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff9e);
      local_50 = mcmlck(ctx,local_48);
      mVar3 = local_48;
    }
  }
  mcmunlck((mcmcxdef *)CONCAT26(mVar3,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff9e);
  return 1;
}

Assistant:

static int tokthscan(tokthdef *tab, uint hash,
                     int (*cb)(void *, toksdef *, mcmon), 
                     void *cbctx)
{
    tokshdef  *symh;
    toksdef   *sym;
    tokthpdef  p;
    tokthpdef  nxt;
    uchar     *pg;
    mcmcxdef  *mctx = tab->tokthmem;
    mcmon      curobj;

    /* get first object, and lock its page if there is one */
    OSCPYSTRUCT(p, tab->tokthhsh[hash]);
    if ((curobj = p.tokthpobj) != MCMONINV)
        pg = mcmlck(mctx, curobj);

    /* look for a match using the callback */
    for ( ; p.tokthpobj != MCMONINV ; OSCPYSTRUCT(p, nxt))
    {
        symh = (tokshdef *)(pg + p.tokthpofs);
        sym = &symh->tokshsc;
        OSCPYSTRUCT(nxt, symh->tokshnxt);

        /* check for a match; copy to return buffer if found */
        if ((*cb)(cbctx, sym, p.tokthpobj))
        {
            mcmunlck(mctx, p.tokthpobj);
            return(TRUE);
        }
        
        /* if the next page is different from this one, get new lock */
        if (nxt.tokthpobj != curobj && nxt.tokthpobj != MCMONINV)
        {
            mcmunlck(mctx, curobj);
            curobj = nxt.tokthpobj;
            pg = mcmlck(mctx, curobj);
        }
    }

    /* unlock last object, if we had a lock at all */
    if (curobj != MCMONINV) mcmunlck(mctx, curobj);
    return(FALSE);
}